

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

int sfts_read_key_internal(sfts_t *f,sfkey_t *k)

{
  char cVar1;
  int iVar2;
  int *status;
  long *in_RSI;
  void *in_RDI;
  int unaff_retaddr;
  fitsfile *in_stack_00000008;
  int *s;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  status = (int *)((long)in_RDI + 0x20);
  if (*in_RSI == 0) {
    _p2sc_msg("sfts_read_key_internal",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1df,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,"NULL keyword");
    exit(1);
  }
  cVar1 = (char)in_RSI[1];
  if (cVar1 == 'F') {
    in_RSI[2] = 0;
    ffgky(in_stack_00000008,unaff_retaddr,
          (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
          (char *)in_RSI,status);
  }
  else if (cVar1 == 'I') {
    in_RSI[2] = 0;
    ffgky(in_stack_00000008,unaff_retaddr,
          (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
          (char *)in_RSI,status);
  }
  else {
    if (cVar1 != 'S') {
      _p2sc_msg("sfts_read_key_internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                ,499,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,
                "Keyword %s: unknown key type %d",*in_RSI,(int)(char)in_RSI[1]);
      exit(1);
    }
    *(undefined1 *)in_RSI[2] = 0;
    ffgky(in_stack_00000008,unaff_retaddr,
          (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
          (char *)in_RSI,status);
  }
  iVar2 = *status;
  if (iVar2 == 0xcc) {
    *status = 0;
  }
  return (uint)(iVar2 != 0xcc);
}

Assistant:

static int sfts_read_key_internal(sfts_t *f, sfkey_t *k) {
    int *s = &f->stat;

    if (!k->k) {
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "NULL keyword");
        return 0;
    }

    switch (k->t) {
    case 'S':
        *k->v.s = 0;
        fits_read_key(f->fts, TSTRING, k->k, k->v.s, NULL, s);
        break;
    case 'I':
        /* long long */
        k->v.i = 0;
        fits_read_key(f->fts, TLONGLONG, k->k, &k->v.i, NULL, s);
        break;
    case 'F':
        /* double */
        k->v.f = 0;
        fits_read_key(f->fts, TDOUBLE, k->k, &k->v.f, NULL, s);
        break;
    default:
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "Keyword %s: unknown key type %d", k->k, k->t);
        return 0;
    }

    if (*s == VALUE_UNDEFINED) {
        *s = 0;
        return 0;
    }
    return 1;
}